

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

ptls_aead_context_t * create_retry_aead(quicly_context_t *ctx,uint32_t protocol_version,int is_enc)

{
  undefined1 *puVar1;
  ptls_cipher_suite_t *ppVar2;
  ptls_aead_context_t *ppVar3;
  undefined1 *puVar4;
  
  puVar1 = (undefined1 *)0x0;
  if (protocol_version == 0xff00001b) {
    puVar1 = get_salt_draft27;
  }
  puVar4 = get_salt_current;
  if (protocol_version != 0xff00001d) {
    puVar4 = puVar1;
  }
  if (puVar4 != (undefined1 *)0x0) {
    ppVar2 = get_aes128gcmsha256(ctx);
    ppVar3 = ptls_aead_new_direct(ppVar2->aead,is_enc,puVar4 + 0x14,puVar4 + 0x24);
    if (ppVar3 != (ptls_aead_context_t *)0x0) {
      return ppVar3;
    }
    __assert_fail("aead != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x22f,"ptls_aead_context_t *create_retry_aead(quicly_context_t *, uint32_t, int)"
                 );
  }
  __assert_fail("salt != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                ,0x22b,"ptls_aead_context_t *create_retry_aead(quicly_context_t *, uint32_t, int)");
}

Assistant:

static ptls_aead_context_t *create_retry_aead(quicly_context_t *ctx, uint32_t protocol_version, int is_enc)
{
    const struct st_ptls_salt_t *salt = get_salt(protocol_version);
    assert(salt != NULL);

    ptls_cipher_suite_t *algo = get_aes128gcmsha256(ctx);
    ptls_aead_context_t *aead = ptls_aead_new_direct(algo->aead, is_enc, salt->retry.key, salt->retry.iv);
    assert(aead != NULL);
    return aead;
}